

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O1

size_t ithi_copy_to_safe_text(char *text,size_t text_max,uint8_t *x_in,size_t l_in)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  if (text_max < 2 || l_in == 0) {
    sVar8 = 0;
  }
  else {
    bVar11 = true;
    uVar7 = 0;
    uVar4 = 1;
    uVar5 = 1;
    uVar10 = 0;
    do {
      sVar8 = uVar5;
      uVar9 = uVar4;
      bVar1 = x_in[uVar10];
      if ((byte)(bVar1 - 0x21) < 0x5e) {
        if ((bVar1 < 0x2d) && ((0x108400000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
        goto LAB_0016720e;
        if ((int)uVar9 == 1) {
          bVar3 = false;
          bVar6 = false;
          if (bVar1 == 0x3d) goto LAB_001671f6;
        }
        else {
          bVar3 = false;
          bVar6 = false;
        }
      }
      else {
LAB_001671f6:
        if (((bVar1 != 0x20) || (l_in - 1 == uVar10)) || (bVar11)) {
LAB_0016720e:
          bVar3 = true;
          bVar6 = bVar11;
        }
        else {
          bVar3 = false;
          bVar6 = true;
        }
      }
      bVar11 = bVar6;
      if (bVar3) {
        if (uVar7 + 5 < text_max) {
          text[uVar7] = '\\';
          cVar2 = (char)((uint)bVar1 * 0x29 >> 0xc);
          text[sVar8] = cVar2 + '0';
          text[uVar7 + 2] = (byte)((uint)(byte)(bVar1 + cVar2 * -100) * 0x67 >> 10) | 0x30;
          text[uVar7 + 3] = bVar1 + (bVar1 / 5 & 0xfe) * -5 | 0x30;
          sVar8 = uVar7 + 4;
        }
        else {
          text[uVar7] = '!';
        }
      }
      else {
        text[uVar7] = bVar1;
      }
      if (l_in <= uVar9) break;
      uVar7 = sVar8;
      uVar4 = (ulong)((int)uVar9 + 1);
      uVar5 = sVar8 + 1;
      uVar10 = uVar9;
    } while (sVar8 + 1 < text_max);
  }
  if (sVar8 < text_max) {
    text[sVar8] = '\0';
  }
  return sVar8;
}

Assistant:

size_t ithi_copy_to_safe_text(char* text, size_t text_max, uint8_t * x_in, size_t l_in)
{
    size_t text_length = 0;
    bool previous_was_space = true; /* Cannot have space at beginning */

    /* escape any non printable character */
    for (uint32_t i = 0; i < l_in && text_length + 1 < text_max; i++)
    {
        int x = x_in[i];
        bool should_escape = false;

        if (x > ' ' && x < 127 && x != '"' && x != ',' && x != '"' && x != '\''
            && (x != '=' || i > 0))
        {
            previous_was_space = false;
        }
        else if (x == ' ' && !previous_was_space && i != l_in - 1)
        {
            /* Cannot have several spaces */
            previous_was_space = true;
        }
        else
        {
            should_escape = true;
        }

        if (should_escape) {
            if (text_length + 5 < text_max) {
                text[text_length++] = '\\';
                text[text_length++] = '0' + (x / 100);
                text[text_length++] = '0' + (x % 100) / 10;
                text[text_length++] = '0' + x % 10;
            }
            else {
                text[text_length++] = '!';
            }
        }
        else {
            text[text_length++] = (char)x;
        }
    }

    if (text_length < text_max) {
        text[text_length] = 0;
    }

    return (text_length);
}